

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_RESTORE_EXP(effect_handler_context_t_conflict *context)

{
  int iVar1;
  int iVar2;
  
  iVar2 = player->max_exp;
  iVar1 = player->exp;
  if (iVar1 < iVar2) {
    if ((context->origin).what != SRC_NONE) {
      msg("You feel your life energies returning.");
      iVar2 = player->max_exp;
      iVar1 = player->exp;
    }
    player_exp_gain(player,iVar2 - iVar1);
    update_stuff(player);
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_RESTORE_EXP(effect_handler_context_t *context)
{
	/* Restore experience */
	if (player->exp < player->max_exp) {
		/* Message */
		if (context->origin.what != SRC_NONE)
			msg("You feel your life energies returning.");
		player_exp_gain(player, player->max_exp - player->exp);

		/* Recalculate max. hitpoints */
		update_stuff(player);
	}

	/* Did something */
	context->ident = true;

	return (true);
}